

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O2

bool __thiscall SafeQueue<WriterData>::push(SafeQueue<WriterData> *this,WriterData *val)

{
  ulong uVar1;
  size_type sVar2;
  
  std::mutex::lock(&this->m_mtx);
  sVar2 = std::deque<WriterData,_std::allocator<WriterData>_>::size(&(this->m_queue).c);
  uVar1 = this->m_maxSize;
  if (sVar2 < uVar1) {
    std::deque<WriterData,_std::allocator<WriterData>_>::push_back(&(this->m_queue).c,val);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
  return sVar2 < uVar1;
}

Assistant:

virtual bool push(const T& val)
    {
        std::lock_guard<std::mutex> lk(m_mtx);

        if (m_queue.size() >= m_maxSize)
            return false;

        m_queue.push(val);
        return true;
    }